

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::ClipperOffset::DoSquare(ClipperOffset *this,int j,int k)

{
  pointer *ppIVar1;
  pointer pDVar2;
  pointer pIVar3;
  double dVar4;
  iterator iVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  IntPoint local_48;
  double local_38;
  double dStack_30;
  
  pDVar2 = (this->m_normals).
           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  dVar8 = atan2(this->m_sinA,pDVar2[k].X * pDVar2[j].X + pDVar2[k].Y * pDVar2[j].Y);
  dVar9 = tan(dVar8 * 0.25);
  pIVar3 = (this->m_srcPoly).
           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
           super__Vector_impl_data._M_start;
  pDVar2 = (this->m_normals).
           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
           _M_impl.super__Vector_impl_data._M_start + k;
  dVar8 = pDVar2->X;
  dVar4 = pDVar2->Y;
  dVar10 = this->m_delta * (-dVar4 * dVar9 + dVar8) + (double)pIVar3[j].X;
  dVar8 = this->m_delta * (dVar8 * dVar9 + dVar4) + (double)pIVar3[j].Y;
  uVar6 = -(ulong)(dVar10 < 0.0);
  uVar7 = -(ulong)(dVar8 < 0.0);
  local_48.X = (cInt)((double)(uVar6 & 0xbfe0000000000000 | ~uVar6 & 0x3fe0000000000000) + dVar10);
  local_48.Y = (cInt)((double)(uVar7 & 0xbfe0000000000000 | ~uVar7 & 0x3fe0000000000000) + dVar8);
  iVar5._M_current =
       (this->m_destPoly).
       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->m_destPoly).
      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_38 = dVar9;
    dStack_30 = dVar9;
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
    _M_realloc_insert<ClipperLib::IntPoint>(&this->m_destPoly,iVar5,&local_48);
    iVar5._M_current =
         (this->m_destPoly).
         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
         super__Vector_impl_data._M_finish;
    dVar9 = local_38;
    dVar8 = dStack_30;
  }
  else {
    (iVar5._M_current)->X = local_48.X;
    (iVar5._M_current)->Y = local_48.Y;
    iVar5._M_current =
         (this->m_destPoly).
         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->m_destPoly).
    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar5._M_current;
    dVar8 = dVar9;
  }
  pIVar3 = (this->m_srcPoly).
           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
           super__Vector_impl_data._M_start;
  pDVar2 = (this->m_normals).
           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
           _M_impl.super__Vector_impl_data._M_start + j;
  dVar4 = pDVar2->X;
  dVar10 = pDVar2->Y;
  dVar9 = this->m_delta * (dVar10 * dVar9 + dVar4) + (double)pIVar3[j].X;
  dVar8 = this->m_delta * (-dVar4 * dVar8 + dVar10) + (double)pIVar3[j].Y;
  uVar6 = -(ulong)(dVar9 < 0.0);
  uVar7 = -(ulong)(dVar8 < 0.0);
  local_48.X = (cInt)((double)(uVar6 & 0xbfe0000000000000 | ~uVar6 & 0x3fe0000000000000) + dVar9);
  local_48.Y = (cInt)((double)(uVar7 & 0xbfe0000000000000 | ~uVar7 & 0x3fe0000000000000) + dVar8);
  if (iVar5._M_current ==
      (this->m_destPoly).
      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
    _M_realloc_insert<ClipperLib::IntPoint>(&this->m_destPoly,iVar5,&local_48);
  }
  else {
    (iVar5._M_current)->X = local_48.X;
    (iVar5._M_current)->Y = local_48.Y;
    ppIVar1 = &(this->m_destPoly).
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppIVar1 = *ppIVar1 + 1;
  }
  return;
}

Assistant:

void ClipperOffset::DoSquare(int j, int k)
{
  double dx = std::tan(std::atan2(m_sinA,
      m_normals[k].X * m_normals[j].X + m_normals[k].Y * m_normals[j].Y) / 4);
  m_destPoly.push_back(IntPoint(
      Round(m_srcPoly[j].X + m_delta * (m_normals[k].X - m_normals[k].Y * dx)),
      Round(m_srcPoly[j].Y + m_delta * (m_normals[k].Y + m_normals[k].X * dx))));
  m_destPoly.push_back(IntPoint(
      Round(m_srcPoly[j].X + m_delta * (m_normals[j].X + m_normals[j].Y * dx)),
      Round(m_srcPoly[j].Y + m_delta * (m_normals[j].Y - m_normals[j].X * dx))));
}